

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

cram_slice * cram_new_slice(cram_content_type type,int nrecs)

{
  cram_slice *s;
  cram_block_slice_hdr *pcVar1;
  cram_record *pcVar2;
  cram_block *pcVar3;
  string_alloc_t *psVar4;
  kh_m_s2i_t *pkVar5;
  
  s = (cram_slice *)calloc(1,0x100);
  if (s != (cram_slice *)0x0) {
    pcVar1 = (cram_block_slice_hdr *)calloc(1,0x48);
    s->hdr = pcVar1;
    if (pcVar1 != (cram_block_slice_hdr *)0x0) {
      pcVar1->content_type = type;
      pcVar2 = (cram_record *)malloc((long)nrecs * 0x70);
      s->hdr_block = (cram_block *)0x0;
      s->block = (cram_block **)0x0;
      *(undefined8 *)((long)&s->block + 4) = 0;
      *(undefined8 *)((long)&s->block_by_id + 4) = 0;
      s->crecs = pcVar2;
      if (pcVar2 != (cram_record *)0x0) {
        pcVar3 = (cram_block *)malloc(0x40);
        s->cigar = (uint32_t *)0x0;
        s->cigar_alloc = 0;
        s->ncigar = 0;
        if (pcVar3 == (cram_block *)0x0) {
          pcVar3 = (cram_block *)0x0;
        }
        else {
          pcVar3->method = RAW;
          pcVar3->orig_method = RAW;
          pcVar3->content_type = EXTERNAL;
          pcVar3->content_id = 0;
          pcVar3->comp_size = 0;
          pcVar3->uncomp_size = 0;
          pcVar3->data = (uchar *)0x0;
          pcVar3->alloc = 0;
          pcVar3->byte = 0;
          pcVar3->bit = 7;
        }
        s->seqs_blk = pcVar3;
        if (pcVar3 != (cram_block *)0x0) {
          pcVar3 = (cram_block *)malloc(0x40);
          if (pcVar3 == (cram_block *)0x0) {
            pcVar3 = (cram_block *)0x0;
          }
          else {
            pcVar3->method = RAW;
            pcVar3->orig_method = RAW;
            pcVar3->content_type = EXTERNAL;
            pcVar3->content_id = 0xc;
            pcVar3->comp_size = 0;
            pcVar3->uncomp_size = 0;
            pcVar3->data = (uchar *)0x0;
            pcVar3->alloc = 0;
            pcVar3->byte = 0;
            pcVar3->bit = 7;
          }
          s->qual_blk = pcVar3;
          if (pcVar3 != (cram_block *)0x0) {
            pcVar3 = (cram_block *)malloc(0x40);
            if (pcVar3 == (cram_block *)0x0) {
              pcVar3 = (cram_block *)0x0;
            }
            else {
              pcVar3->method = RAW;
              pcVar3->orig_method = RAW;
              pcVar3->content_type = EXTERNAL;
              pcVar3->content_id = 0xb;
              pcVar3->comp_size = 0;
              pcVar3->uncomp_size = 0;
              pcVar3->data = (uchar *)0x0;
              pcVar3->alloc = 0;
              pcVar3->byte = 0;
              pcVar3->bit = 7;
            }
            s->name_blk = pcVar3;
            if (pcVar3 != (cram_block *)0x0) {
              pcVar3 = (cram_block *)malloc(0x40);
              if (pcVar3 == (cram_block *)0x0) {
                pcVar3 = (cram_block *)0x0;
              }
              else {
                pcVar3->method = RAW;
                pcVar3->orig_method = RAW;
                pcVar3->content_type = EXTERNAL;
                pcVar3->content_id = 1;
                pcVar3->comp_size = 0;
                pcVar3->uncomp_size = 0;
                pcVar3->data = (uchar *)0x0;
                pcVar3->alloc = 0;
                pcVar3->byte = 0;
                pcVar3->bit = 7;
              }
              s->aux_blk = pcVar3;
              if (pcVar3 != (cram_block *)0x0) {
                pcVar3 = (cram_block *)malloc(0x40);
                if (pcVar3 == (cram_block *)0x0) {
                  pcVar3 = (cram_block *)0x0;
                }
                else {
                  pcVar3->method = RAW;
                  pcVar3->orig_method = RAW;
                  pcVar3->content_type = EXTERNAL;
                  pcVar3->content_id = 0xd;
                  pcVar3->comp_size = 0;
                  pcVar3->uncomp_size = 0;
                  pcVar3->data = (uchar *)0x0;
                  pcVar3->alloc = 0;
                  pcVar3->byte = 0;
                  pcVar3->bit = 7;
                }
                s->base_blk = pcVar3;
                if (pcVar3 != (cram_block *)0x0) {
                  pcVar3 = (cram_block *)malloc(0x40);
                  if (pcVar3 == (cram_block *)0x0) {
                    pcVar3 = (cram_block *)0x0;
                  }
                  else {
                    pcVar3->method = RAW;
                    pcVar3->orig_method = RAW;
                    pcVar3->content_type = EXTERNAL;
                    pcVar3->content_id = 0xe;
                    pcVar3->comp_size = 0;
                    pcVar3->uncomp_size = 0;
                    pcVar3->data = (uchar *)0x0;
                    pcVar3->alloc = 0;
                    pcVar3->byte = 0;
                    pcVar3->bit = 7;
                  }
                  s->soft_blk = pcVar3;
                  if (pcVar3 != (cram_block *)0x0) {
                    s->TN = (uint32_t *)0x0;
                    s->nTN = 0;
                    s->aTN = 0;
                    s->features = (cram_feature *)0x0;
                    s->nfeatures = 0;
                    s->afeatures = 0;
                    psVar4 = string_pool_create(0x2000);
                    s->pair_keys = psVar4;
                    if (psVar4 != (string_alloc_t *)0x0) {
                      pkVar5 = (kh_m_s2i_t *)calloc(1,0x28);
                      s->pair[0] = pkVar5;
                      if (pkVar5 != (kh_m_s2i_t *)0x0) {
                        pkVar5 = (kh_m_s2i_t *)calloc(1,0x28);
                        s->pair[1] = pkVar5;
                        if (pkVar5 != (kh_m_s2i_t *)0x0) {
                          return s;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    cram_free_slice(s);
  }
  return (cram_slice *)0x0;
}

Assistant:

cram_slice *cram_new_slice(enum cram_content_type type, int nrecs) {
    cram_slice *s = calloc(1, sizeof(*s));
    if (!s)
	return NULL;

    if (!(s->hdr = (cram_block_slice_hdr *)calloc(1, sizeof(*s->hdr))))
	goto err;
    s->hdr->content_type = type;

    s->hdr_block = NULL;
    s->block = NULL;
    s->block_by_id = NULL;
    s->last_apos = 0;
    if (!(s->crecs = malloc(nrecs * sizeof(cram_record))))  goto err;
    s->cigar = NULL;
    s->cigar_alloc = 0;
    s->ncigar = 0;

    if (!(s->seqs_blk = cram_new_block(EXTERNAL, 0)))       goto err;
    if (!(s->qual_blk = cram_new_block(EXTERNAL, DS_QS)))   goto err;
    if (!(s->name_blk = cram_new_block(EXTERNAL, DS_RN)))   goto err;
    if (!(s->aux_blk  = cram_new_block(EXTERNAL, DS_aux)))  goto err;
    if (!(s->base_blk = cram_new_block(EXTERNAL, DS_IN)))   goto err;
    if (!(s->soft_blk = cram_new_block(EXTERNAL, DS_SC)))   goto err;

    s->features = NULL;
    s->nfeatures = s->afeatures = 0;

#ifndef TN_external
    s->TN = NULL;
    s->nTN = s->aTN = 0;
#endif

    // Volatile keys as we do realloc in dstring
    if (!(s->pair_keys = string_pool_create(8192))) goto err;
    if (!(s->pair[0] = kh_init(m_s2i)))             goto err;
    if (!(s->pair[1] = kh_init(m_s2i)))             goto err;
    
#ifdef BA_external
    s->BA_len = 0;
#endif

    return s;

 err:
    if (s)
	cram_free_slice(s);

    return NULL;
}